

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_SHA2_512.c
# Opt level: O0

void Hacl_Impl_SHA2_512_init(uint64_t *state)

{
  undefined8 *in_RDI;
  uint64_t *p28;
  uint64_t *p18;
  uint64_t *p27;
  uint64_t *p17;
  uint64_t *p26;
  uint64_t *p16;
  uint64_t *p25;
  uint64_t *p15;
  uint64_t *p24;
  uint64_t *p14;
  uint64_t *p23;
  uint64_t *p13;
  uint64_t *p22;
  uint64_t *p12;
  uint64_t *p21;
  uint64_t *p11;
  uint64_t *p5;
  uint64_t *p4;
  uint64_t *p3;
  uint64_t *p20;
  uint64_t *p10;
  uint64_t *h_01;
  uint64_t *k1;
  uint64_t *p2;
  uint64_t *p115;
  uint64_t *p215;
  uint64_t *p114;
  uint64_t *p214;
  uint64_t *p1;
  uint64_t *p213;
  uint64_t *p113;
  uint64_t *p212;
  uint64_t *p112;
  uint64_t *p211;
  uint64_t *p111;
  uint64_t *p210;
  uint64_t *p110;
  uint64_t *p29;
  uint64_t *p19;
  
  *in_RDI = 0x428a2f98d728ae22;
  in_RDI[1] = 0x7137449123ef65cd;
  in_RDI[2] = 0xb5c0fbcfec4d3b2f;
  in_RDI[3] = 0xe9b5dba58189dbbc;
  in_RDI[4] = 0x3956c25bf348b538;
  in_RDI[5] = 0x59f111f1b605d019;
  in_RDI[6] = 0x923f82a4af194f9b;
  in_RDI[7] = 0xab1c5ed5da6d8118;
  in_RDI[8] = 0xd807aa98a3030242;
  in_RDI[9] = 0x12835b0145706fbe;
  in_RDI[10] = 0x243185be4ee4b28c;
  in_RDI[0xb] = 0x550c7dc3d5ffb4e2;
  in_RDI[0xc] = 0x72be5d74f27b896f;
  in_RDI[0xd] = 0x80deb1fe3b1696b1;
  in_RDI[0xe] = 0x9bdc06a725c71235;
  in_RDI[0xf] = 0xc19bf174cf692694;
  in_RDI[0x10] = 0xe49b69c19ef14ad2;
  in_RDI[0x11] = 0xefbe4786384f25e3;
  in_RDI[0x12] = 0xfc19dc68b8cd5b5;
  in_RDI[0x13] = 0x240ca1cc77ac9c65;
  in_RDI[0x14] = 0x2de92c6f592b0275;
  in_RDI[0x15] = 0x4a7484aa6ea6e483;
  in_RDI[0x16] = 0x5cb0a9dcbd41fbd4;
  in_RDI[0x17] = 0x76f988da831153b5;
  in_RDI[0x18] = 0x983e5152ee66dfab;
  in_RDI[0x19] = 0xa831c66d2db43210;
  in_RDI[0x1a] = 0xb00327c898fb213f;
  in_RDI[0x1b] = 0xbf597fc7beef0ee4;
  in_RDI[0x1c] = 0xc6e00bf33da88fc2;
  in_RDI[0x1d] = 0xd5a79147930aa725;
  in_RDI[0x1e] = 0x6ca6351e003826f;
  in_RDI[0x1f] = 0x142929670a0e6e70;
  in_RDI[0x20] = 0x27b70a8546d22ffc;
  in_RDI[0x21] = 0x2e1b21385c26c926;
  in_RDI[0x22] = 0x4d2c6dfc5ac42aed;
  in_RDI[0x23] = 0x53380d139d95b3df;
  in_RDI[0x24] = 0x650a73548baf63de;
  in_RDI[0x25] = 0x766a0abb3c77b2a8;
  in_RDI[0x26] = 0x81c2c92e47edaee6;
  in_RDI[0x27] = 0x92722c851482353b;
  in_RDI[0x28] = 0xa2bfe8a14cf10364;
  in_RDI[0x29] = 0xa81a664bbc423001;
  in_RDI[0x2a] = 0xc24b8b70d0f89791;
  in_RDI[0x2b] = 0xc76c51a30654be30;
  in_RDI[0x2c] = 0xd192e819d6ef5218;
  in_RDI[0x2d] = 0xd69906245565a910;
  in_RDI[0x2e] = 0xf40e35855771202a;
  in_RDI[0x2f] = 0x106aa07032bbd1b8;
  in_RDI[0x30] = 0x19a4c116b8d2d0c8;
  in_RDI[0x31] = 0x1e376c085141ab53;
  in_RDI[0x32] = 0x2748774cdf8eeb99;
  in_RDI[0x33] = 0x34b0bcb5e19b48a8;
  in_RDI[0x34] = 0x391c0cb3c5c95a63;
  in_RDI[0x35] = 0x4ed8aa4ae3418acb;
  in_RDI[0x36] = 0x5b9cca4f7763e373;
  in_RDI[0x37] = 0x682e6ff3d6b2b8a3;
  in_RDI[0x38] = 0x748f82ee5defb2fc;
  in_RDI[0x39] = 0x78a5636f43172f60;
  in_RDI[0x3a] = 0x84c87814a1f0ab72;
  in_RDI[0x3b] = 0x8cc702081a6439ec;
  in_RDI[0x3c] = 0x90befffa23631e28;
  in_RDI[0x3d] = 0xa4506cebde82bde9;
  in_RDI[0x3e] = 0xbef9a3f7b2c67915;
  in_RDI[0x3f] = 0xc67178f2e372532b;
  in_RDI[0x40] = 0xca273eceea26619c;
  in_RDI[0x41] = 0xd186b8c721c0c207;
  in_RDI[0x42] = 0xeada7dd6cde0eb1e;
  in_RDI[0x43] = 0xf57d4f7fee6ed178;
  in_RDI[0x44] = 0x6f067aa72176fba;
  in_RDI[0x45] = 0xa637dc5a2c898a6;
  in_RDI[0x46] = 0x113f9804bef90dae;
  in_RDI[0x47] = 0x1b710b35131c471b;
  in_RDI[0x48] = 0x28db77f523047d84;
  in_RDI[0x49] = 0x32caab7b40c72493;
  in_RDI[0x4a] = 0x3c9ebe0a15c9bebc;
  in_RDI[0x4b] = 0x431d67c49c100d4c;
  in_RDI[0x4c] = 0x4cc5d4becb3e42b6;
  in_RDI[0x4d] = 0x597f299cfc657e2a;
  in_RDI[0x4e] = 0x5fcb6fab3ad6faec;
  in_RDI[0x4f] = 0x6c44198c4a475817;
  in_RDI[0xa0] = 0x6a09e667f3bcc908;
  in_RDI[0xa1] = 0xbb67ae8584caa73b;
  in_RDI[0xa2] = 0x3c6ef372fe94f82b;
  in_RDI[0xa3] = 0xa54ff53a5f1d36f1;
  in_RDI[0xa4] = 0x510e527fade682d1;
  in_RDI[0xa5] = 0x9b05688c2b3e6c1f;
  in_RDI[0xa6] = 0x1f83d9abfb41bd6b;
  in_RDI[0xa7] = 0x5be0cd19137e2179;
  return;
}

Assistant:

static void Hacl_Impl_SHA2_512_init(uint64_t *state)
{
  uint64_t *k1 = state;
  uint64_t *h_01 = state + (uint32_t)160U;
  uint64_t *p10 = k1;
  uint64_t *p20 = k1 + (uint32_t)16U;
  uint64_t *p3 = k1 + (uint32_t)32U;
  uint64_t *p4 = k1 + (uint32_t)48U;
  uint64_t *p5 = k1 + (uint32_t)64U;
  uint64_t *p11 = p10;
  uint64_t *p21 = p10 + (uint32_t)8U;
  uint64_t *p12 = p11;
  uint64_t *p22 = p11 + (uint32_t)4U;
  p12[0U] = (uint64_t)0x428a2f98d728ae22U;
  p12[1U] = (uint64_t)0x7137449123ef65cdU;
  p12[2U] = (uint64_t)0xb5c0fbcfec4d3b2fU;
  p12[3U] = (uint64_t)0xe9b5dba58189dbbcU;
  p22[0U] = (uint64_t)0x3956c25bf348b538U;
  p22[1U] = (uint64_t)0x59f111f1b605d019U;
  p22[2U] = (uint64_t)0x923f82a4af194f9bU;
  p22[3U] = (uint64_t)0xab1c5ed5da6d8118U;
  uint64_t *p13 = p21;
  uint64_t *p23 = p21 + (uint32_t)4U;
  p13[0U] = (uint64_t)0xd807aa98a3030242U;
  p13[1U] = (uint64_t)0x12835b0145706fbeU;
  p13[2U] = (uint64_t)0x243185be4ee4b28cU;
  p13[3U] = (uint64_t)0x550c7dc3d5ffb4e2U;
  p23[0U] = (uint64_t)0x72be5d74f27b896fU;
  p23[1U] = (uint64_t)0x80deb1fe3b1696b1U;
  p23[2U] = (uint64_t)0x9bdc06a725c71235U;
  p23[3U] = (uint64_t)0xc19bf174cf692694U;
  uint64_t *p14 = p20;
  uint64_t *p24 = p20 + (uint32_t)8U;
  uint64_t *p15 = p14;
  uint64_t *p25 = p14 + (uint32_t)4U;
  p15[0U] = (uint64_t)0xe49b69c19ef14ad2U;
  p15[1U] = (uint64_t)0xefbe4786384f25e3U;
  p15[2U] = (uint64_t)0x0fc19dc68b8cd5b5U;
  p15[3U] = (uint64_t)0x240ca1cc77ac9c65U;
  p25[0U] = (uint64_t)0x2de92c6f592b0275U;
  p25[1U] = (uint64_t)0x4a7484aa6ea6e483U;
  p25[2U] = (uint64_t)0x5cb0a9dcbd41fbd4U;
  p25[3U] = (uint64_t)0x76f988da831153b5U;
  uint64_t *p16 = p24;
  uint64_t *p26 = p24 + (uint32_t)4U;
  p16[0U] = (uint64_t)0x983e5152ee66dfabU;
  p16[1U] = (uint64_t)0xa831c66d2db43210U;
  p16[2U] = (uint64_t)0xb00327c898fb213fU;
  p16[3U] = (uint64_t)0xbf597fc7beef0ee4U;
  p26[0U] = (uint64_t)0xc6e00bf33da88fc2U;
  p26[1U] = (uint64_t)0xd5a79147930aa725U;
  p26[2U] = (uint64_t)0x06ca6351e003826fU;
  p26[3U] = (uint64_t)0x142929670a0e6e70U;
  uint64_t *p17 = p3;
  uint64_t *p27 = p3 + (uint32_t)8U;
  uint64_t *p18 = p17;
  uint64_t *p28 = p17 + (uint32_t)4U;
  p18[0U] = (uint64_t)0x27b70a8546d22ffcU;
  p18[1U] = (uint64_t)0x2e1b21385c26c926U;
  p18[2U] = (uint64_t)0x4d2c6dfc5ac42aedU;
  p18[3U] = (uint64_t)0x53380d139d95b3dfU;
  p28[0U] = (uint64_t)0x650a73548baf63deU;
  p28[1U] = (uint64_t)0x766a0abb3c77b2a8U;
  p28[2U] = (uint64_t)0x81c2c92e47edaee6U;
  p28[3U] = (uint64_t)0x92722c851482353bU;
  uint64_t *p19 = p27;
  uint64_t *p29 = p27 + (uint32_t)4U;
  p19[0U] = (uint64_t)0xa2bfe8a14cf10364U;
  p19[1U] = (uint64_t)0xa81a664bbc423001U;
  p19[2U] = (uint64_t)0xc24b8b70d0f89791U;
  p19[3U] = (uint64_t)0xc76c51a30654be30U;
  p29[0U] = (uint64_t)0xd192e819d6ef5218U;
  p29[1U] = (uint64_t)0xd69906245565a910U;
  p29[2U] = (uint64_t)0xf40e35855771202aU;
  p29[3U] = (uint64_t)0x106aa07032bbd1b8U;
  uint64_t *p110 = p4;
  uint64_t *p210 = p4 + (uint32_t)8U;
  uint64_t *p111 = p110;
  uint64_t *p211 = p110 + (uint32_t)4U;
  p111[0U] = (uint64_t)0x19a4c116b8d2d0c8U;
  p111[1U] = (uint64_t)0x1e376c085141ab53U;
  p111[2U] = (uint64_t)0x2748774cdf8eeb99U;
  p111[3U] = (uint64_t)0x34b0bcb5e19b48a8U;
  p211[0U] = (uint64_t)0x391c0cb3c5c95a63U;
  p211[1U] = (uint64_t)0x4ed8aa4ae3418acbU;
  p211[2U] = (uint64_t)0x5b9cca4f7763e373U;
  p211[3U] = (uint64_t)0x682e6ff3d6b2b8a3U;
  uint64_t *p112 = p210;
  uint64_t *p212 = p210 + (uint32_t)4U;
  p112[0U] = (uint64_t)0x748f82ee5defb2fcU;
  p112[1U] = (uint64_t)0x78a5636f43172f60U;
  p112[2U] = (uint64_t)0x84c87814a1f0ab72U;
  p112[3U] = (uint64_t)0x8cc702081a6439ecU;
  p212[0U] = (uint64_t)0x90befffa23631e28U;
  p212[1U] = (uint64_t)0xa4506cebde82bde9U;
  p212[2U] = (uint64_t)0xbef9a3f7b2c67915U;
  p212[3U] = (uint64_t)0xc67178f2e372532bU;
  uint64_t *p113 = p5;
  uint64_t *p213 = p5 + (uint32_t)8U;
  uint64_t *p1 = p113;
  uint64_t *p214 = p113 + (uint32_t)4U;
  p1[0U] = (uint64_t)0xca273eceea26619cU;
  p1[1U] = (uint64_t)0xd186b8c721c0c207U;
  p1[2U] = (uint64_t)0xeada7dd6cde0eb1eU;
  p1[3U] = (uint64_t)0xf57d4f7fee6ed178U;
  p214[0U] = (uint64_t)0x06f067aa72176fbaU;
  p214[1U] = (uint64_t)0x0a637dc5a2c898a6U;
  p214[2U] = (uint64_t)0x113f9804bef90daeU;
  p214[3U] = (uint64_t)0x1b710b35131c471bU;
  uint64_t *p114 = p213;
  uint64_t *p215 = p213 + (uint32_t)4U;
  p114[0U] = (uint64_t)0x28db77f523047d84U;
  p114[1U] = (uint64_t)0x32caab7b40c72493U;
  p114[2U] = (uint64_t)0x3c9ebe0a15c9bebcU;
  p114[3U] = (uint64_t)0x431d67c49c100d4cU;
  p215[0U] = (uint64_t)0x4cc5d4becb3e42b6U;
  p215[1U] = (uint64_t)0x597f299cfc657e2aU;
  p215[2U] = (uint64_t)0x5fcb6fab3ad6faecU;
  p215[3U] = (uint64_t)0x6c44198c4a475817U;
  uint64_t *p115 = h_01;
  uint64_t *p2 = h_01 + (uint32_t)4U;
  p115[0U] = (uint64_t)0x6a09e667f3bcc908U;
  p115[1U] = (uint64_t)0xbb67ae8584caa73bU;
  p115[2U] = (uint64_t)0x3c6ef372fe94f82bU;
  p115[3U] = (uint64_t)0xa54ff53a5f1d36f1U;
  p2[0U] = (uint64_t)0x510e527fade682d1U;
  p2[1U] = (uint64_t)0x9b05688c2b3e6c1fU;
  p2[2U] = (uint64_t)0x1f83d9abfb41bd6bU;
  p2[3U] = (uint64_t)0x5be0cd19137e2179U;
}